

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_delete_single_string_key(planck_unit_test_t *tc)

{
  undefined4 local_9c;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_none);
  sprintf(key,"k%d",3);
  local_9c = 6;
  bhdct_insert(tc,&dict,key,&local_9c,'\x01');
  bhdct_delete(tc,&dict,key,'\0',1,'\x01');
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_delete_single_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 3);
	bhdct_insert(tc, &dict, key, IONIZE(6, int), boolean_true);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	bhdct_takedown(tc, &dict);
}